

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mustache.hpp
# Opt level: O1

void __thiscall
kainjow::mustache::
delimiter_set<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
::delimiter_set(delimiter_set<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
                *this)

{
  (this->begin)._M_dataplus._M_p = (pointer)&(this->begin).field_2;
  std::__cxx11::wstring::_M_construct<wchar_t*>
            ((wstring *)this,delimiter_set<std::__cxx11::wstring>::default_begin,
             delimiter_set<std::__cxx11::wstring>::default_begin + DAT_00246f60 * 4);
  (this->end)._M_dataplus._M_p = (pointer)&(this->end).field_2;
  std::__cxx11::wstring::_M_construct<wchar_t*>
            ((wstring *)&this->end,delimiter_set<std::__cxx11::wstring>::default_end,
             delimiter_set<std::__cxx11::wstring>::default_end + DAT_00246f88 * 4);
  return;
}

Assistant:

delimiter_set()
        : begin(default_begin)
        , end(default_end)
    {}